

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableGet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableGet *curr)

{
  bool bVar1;
  uint uVar2;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  Literal *this_01;
  Literal local_c0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_90 [8];
  TableInterfaceInfo info;
  undefined1 local_68 [8];
  Flow index;
  TableGet *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  index.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,this_00,
             *(Expression **)(index.breakTo.super_IString.str._M_str + 0x20));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    local_a8 = (((IString *)(index.breakTo.super_IString.str._M_str + 0x10))->str)._M_len;
    uStack_a0 = *(undefined8 *)(index.breakTo.super_IString.str._M_str + 0x18);
    getTableInterfaceInfo
              ((TableInterfaceInfo *)local_90,this,
               (Name)((IString *)(index.breakTo.super_IString.str._M_str + 0x10))->str);
    this_01 = Flow::getSingleValue((Flow *)local_68);
    uVar2 = wasm::Literal::geti32(this_01);
    (*(*(_func_int ***)local_90)[0x1d])
              (&local_c0,local_90,info.interface,info.name.super_IString.str._M_len,(ulong)uVar2);
    Flow::Flow(__return_storage_ptr__,&local_c0);
    wasm::Literal::~Literal(&local_c0);
  }
  info.name.super_IString.str._M_str._0_4_ = 1;
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableGet(TableGet* curr) {
    NOTE_ENTER("TableGet");
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    auto info = getTableInterfaceInfo(curr->table);
    return info.interface->tableLoad(info.name,
                                     index.getSingleValue().geti32());
  }